

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

bool __thiscall
google::protobuf::DescriptorPool::ResolvesFeaturesForImpl(DescriptorPool *this,int extension_number)

{
  RepeatedPtrField<google::protobuf::FeatureSetDefaults_FeatureSetEditionDefault> *this_00;
  void *pvVar1;
  pointer ppFVar2;
  FeatureSetDefaults *pFVar3;
  void **ppvVar4;
  const_iterator cVar5;
  Reflection *this_01;
  pointer ppFVar6;
  long lVar7;
  long lVar8;
  FeatureSet *from;
  MessageLite *from_msg;
  pointer ppFVar9;
  void **ppvVar10;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  fields;
  FeatureSet features;
  _Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  local_98;
  FeatureSet local_80;
  
  pFVar3 = GetFeatureSetDefaults(this);
  this_00 = &(pFVar3->field_0)._impl_.defaults_;
  ppvVar4 = internal::RepeatedPtrFieldBase::elements(&this_00->super_RepeatedPtrFieldBase);
  cVar5 = RepeatedPtrField<google::protobuf::FeatureSetDefaults_FeatureSetEditionDefault>::end
                    (this_00);
  do {
    ppvVar10 = ppvVar4;
    if (ppvVar10 == cVar5.it_) break;
    pvVar1 = *ppvVar10;
    local_98._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_98._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_98._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    from = *(FeatureSet **)((long)pvVar1 + 0x20);
    if (from == (FeatureSet *)0x0) {
      from = (FeatureSet *)&_FeatureSet_default_instance_;
    }
    FeatureSet::FeatureSet(&local_80,from);
    from_msg = *(MessageLite **)((long)pvVar1 + 0x18);
    if (from_msg == (MessageLite *)0x0) {
      from_msg = (MessageLite *)&_FeatureSet_default_instance_;
    }
    FeatureSet::MergeImpl((MessageLite *)&local_80,from_msg);
    this_01 = FeatureSet::GetReflection();
    Reflection::ListFields
              (this_01,&local_80.super_Message,
               (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                *)&local_98);
    ppFVar2 = local_98._M_impl.super__Vector_impl_data._M_finish;
    lVar7 = (long)local_98._M_impl.super__Vector_impl_data._M_finish -
            (long)local_98._M_impl.super__Vector_impl_data._M_start;
    ppFVar6 = local_98._M_impl.super__Vector_impl_data._M_start;
    for (lVar8 = lVar7 >> 5; 0 < lVar8; lVar8 = lVar8 + -1) {
      ppFVar9 = ppFVar6;
      if ((*ppFVar6)->number_ == extension_number) goto LAB_00bf517f;
      if (ppFVar6[1]->number_ == extension_number) {
        ppFVar9 = ppFVar6 + 1;
        goto LAB_00bf517f;
      }
      if (ppFVar6[2]->number_ == extension_number) {
        ppFVar9 = ppFVar6 + 2;
        goto LAB_00bf517f;
      }
      if (ppFVar6[3]->number_ == extension_number) {
        ppFVar9 = ppFVar6 + 3;
        goto LAB_00bf517f;
      }
      ppFVar6 = ppFVar6 + 4;
      lVar7 = lVar7 + -0x20;
    }
    lVar7 = lVar7 >> 3;
    if (lVar7 == 1) {
LAB_00bf5160:
      ppFVar9 = ppFVar6;
      if ((*ppFVar6)->number_ != extension_number) {
        ppFVar9 = local_98._M_impl.super__Vector_impl_data._M_finish;
      }
    }
    else if (lVar7 == 2) {
LAB_00bf5154:
      ppFVar9 = ppFVar6;
      if ((*ppFVar6)->number_ != extension_number) {
        ppFVar6 = ppFVar6 + 1;
        goto LAB_00bf5160;
      }
    }
    else {
      ppFVar9 = local_98._M_impl.super__Vector_impl_data._M_finish;
      if ((lVar7 == 3) && (ppFVar9 = ppFVar6, (*ppFVar6)->number_ != extension_number)) {
        ppFVar6 = ppFVar6 + 1;
        goto LAB_00bf5154;
      }
    }
LAB_00bf517f:
    FeatureSet::~FeatureSet(&local_80);
    std::
    _Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ::~_Vector_base(&local_98);
    ppvVar4 = ppvVar10 + 1;
  } while (ppFVar9 != ppFVar2);
  return ppvVar10 == cVar5.it_;
}

Assistant:

bool DescriptorPool::ResolvesFeaturesForImpl(int extension_number) const {
  for (const auto& edition_default : GetFeatureSetDefaults().defaults()) {
    std::vector<const FieldDescriptor*> fields;
    auto features = edition_default.fixed_features();
    features.MergeFrom(edition_default.overridable_features());
    features.GetReflection()->ListFields(features, &fields);
    if (absl::c_find_if(fields, [&](const FieldDescriptor* field) {
          return field->number() == extension_number;
        }) == fields.end()) {
      return false;
    }
  }
  return true;
}